

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyResyn.c
# Opt level: O0

Ivy_Man_t * Ivy_ManResyn0(Ivy_Man_t *pMan,int fUpdateLevel,int fVerbose)

{
  abctime aVar1;
  Ivy_Man_t *p;
  abctime aVar2;
  Ivy_Man_t *p_00;
  Ivy_Man_t *pTemp;
  abctime clk;
  int fVerbose_local;
  int fUpdateLevel_local;
  Ivy_Man_t *pMan_local;
  
  if (fVerbose != 0) {
    printf("Original:\n");
    Ivy_ManPrintStats(pMan);
  }
  aVar1 = Abc_Clock();
  p = Ivy_ManBalance(pMan,fUpdateLevel);
  if (fVerbose != 0) {
    printf("\n");
    Abc_Print(1,"%s =","Balance");
    aVar2 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar2 - aVar1) * 1.0) / 1000000.0);
    Ivy_ManPrintStats(p);
  }
  aVar1 = Abc_Clock();
  Ivy_ManRewritePre(p,fUpdateLevel,0,0);
  if (fVerbose != 0) {
    printf("\n");
    Abc_Print(1,"%s =","Rewrite");
    aVar2 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar2 - aVar1) * 1.0) / 1000000.0);
    Ivy_ManPrintStats(p);
  }
  aVar1 = Abc_Clock();
  p_00 = Ivy_ManBalance(p,fUpdateLevel);
  Ivy_ManStop(p);
  if (fVerbose != 0) {
    printf("\n");
    Abc_Print(1,"%s =","Balance");
    aVar2 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar2 - aVar1) * 1.0) / 1000000.0);
    Ivy_ManPrintStats(p_00);
  }
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs several passes of rewriting on the AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Ivy_Man_t * Ivy_ManResyn0( Ivy_Man_t * pMan, int fUpdateLevel, int fVerbose )
{
    abctime clk;
    Ivy_Man_t * pTemp;

if ( fVerbose ) { printf( "Original:\n" ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Ivy_ManBalance( pMan, fUpdateLevel );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Balance", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

//    Ivy_ManRewriteAlg( pMan, fUpdateLevel, 0 );
clk = Abc_Clock();
    Ivy_ManRewritePre( pMan, fUpdateLevel, 0, 0 );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Rewrite", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Ivy_ManBalance( pTemp = pMan, fUpdateLevel );
    Ivy_ManStop( pTemp );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Balance", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );
    return pMan;
}